

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O3

string * SSTable::get(string *__return_storage_ptr__,string *fileName,uint64_t key)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  runtime_error *this;
  long *plVar3;
  long *plVar4;
  int _offset;
  uint64_t length;
  uint64_t _key;
  ifstream in;
  int local_27c;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(string *)fileName,_S_in|_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_258,"readDic: Open file ",fileName);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_258);
    local_278 = (long *)*plVar4;
    plVar3 = plVar4 + 2;
    if (local_278 == plVar3) {
      local_268 = *plVar3;
      lStack_260 = plVar4[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *plVar3;
    }
    local_270 = plVar4[1];
    *plVar4 = (long)plVar3;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::runtime_error::runtime_error(this,(string *)&local_278);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::seekg((long)local_238,8);
  std::istream::read((char *)local_238,(long)&local_278);
  std::istream::seekg((long)local_238,0x2820);
  if (local_278 != (long *)0x0) {
    plVar4 = (long *)0x0;
    do {
      std::istream::read((char *)local_238,(long)&local_258);
      std::istream::read((char *)local_238,(long)&local_27c);
      iVar1 = local_27c;
      if (local_258._M_dataplus._M_p == (pointer)key) {
        std::istream::read((char *)local_238,(long)&local_258);
        std::istream::read((char *)local_238,(long)&local_27c);
        if (-1 < iVar1) {
          std::istream::seekg((long)local_238,iVar1 + (int)local_278 * 0xc + 0x282c);
          __s = (char *)operator_new__(((long)local_27c - (long)iVar1) + 1);
          std::istream::read((char *)local_238,(long)__s);
          __s[(long)local_27c - (long)iVar1] = '\0';
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          sVar2 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,__s,__s + sVar2);
          operator_delete__(__s);
          std::ifstream::close();
          goto LAB_0010b069;
        }
        break;
      }
      plVar4 = (long *)((long)plVar4 + 1);
    } while (plVar4 < local_278);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_0010b069:
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

string SSTable::get(const string &fileName, uint64_t key) {
  ifstream in(fileName, ios_base::in | ios_base::binary);
  if (in.fail())
    throw runtime_error("readDic: Open file " + fileName + " failed!");

  in.seekg(8, ifstream::beg);  // skip timeStamp
  uint64_t length;
  read64(in, length);
  in.seekg(10272, ifstream::beg);  // skip header and bloomFilter

  int offset = -1;
  int valueSize = -1;
  for (uint64_t i = 0; i < length; i++) {
    uint64_t _key;
    int _offset;
    read64(in, _key);
    read32(in, _offset);
    if (_key == key) {
      offset = _offset;
      read64(in, _key);
      read32(in, _offset);
      valueSize = _offset - offset;
      break;
    }
  }
  if (offset < 0) return "";
  in.seekg(10272 + (length + 1) * 12 + offset, ifstream::beg);
  char *buf = new char[valueSize + 1];
  in.read(buf, valueSize);
  buf[valueSize] = '\0';
  string value(buf);
  delete[] buf;

  in.close();
  return value;
}